

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistent_storage_json.cpp
# Opt level: O1

Status __thiscall
ot::commissioner::persistent_storage::PersistentStorageJson::LookupAny
          (PersistentStorageJson *this,BorderRouter *aValue,
          vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
          *aRet)

{
  undefined8 uVar1;
  code *pcVar2;
  Status SVar3;
  undefined8 *puVar4;
  _func_bool__Any_data_ptr_BorderRouter_ptr *__tmp_2;
  function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> pred;
  _Any_data __tmp;
  _Any_data local_248;
  code *local_238;
  code *local_230;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  _Any_data local_200;
  code *local_1f0;
  string local_1e0;
  undefined **local_1c0;
  undefined8 local_1b8;
  BorderAgent local_1b0;
  
  local_248._M_unused._M_object = (void *)0x0;
  local_248._8_8_ = 0;
  local_230 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:490:54)>
              ::_M_invoke;
  local_238 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:490:54)>
              ::_M_manager;
  local_1c0 = &PTR__BorderRouter_002e1c80;
  local_1b8._0_4_ = aValue->mId;
  local_1b8._4_4_ = aValue->mNetworkId;
  BorderAgent::BorderAgent(&local_1b0,&aValue->mAgent);
  local_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  puVar4 = (undefined8 *)operator_new(0x188);
  *puVar4 = &PTR__BorderRouter_002e1c80;
  puVar4[1] = local_1b8;
  BorderAgent::BorderAgent((BorderAgent *)(puVar4 + 2),&local_1b0);
  pcVar2 = local_238;
  local_228._M_unused._M_object = local_248._M_unused._M_object;
  uVar1 = local_248._8_8_;
  local_248._8_8_ = local_228._8_8_;
  local_218 = local_238;
  local_238 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:492:12)>
              ::_M_manager;
  pcStack_210 = local_230;
  local_230 = std::
              _Function_handler<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/ps/persistent_storage_json.cpp:492:12)>
              ::_M_invoke;
  local_248._M_unused._M_object = puVar4;
  local_228._8_8_ = uVar1;
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(&local_228,&local_228,__destroy_functor);
  }
  local_1c0 = &PTR__BorderRouter_002e1c80;
  BorderAgent::~BorderAgent(&local_1b0);
  std::function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>::function
            ((function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> *)
             &local_200,
             (function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)> *)
             &local_248);
  local_1e0._M_dataplus._M_p = (pointer)&local_1e0.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e0,JSON_BR_abi_cxx11_,DAT_002e98c8 + JSON_BR_abi_cxx11_);
  SVar3 = LookupPred<ot::commissioner::persistent_storage::BorderRouter>
                    (this,(function<bool_(const_ot::commissioner::persistent_storage::BorderRouter_&)>
                           *)&local_200,aRet,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p);
  }
  if (local_1f0 != (code *)0x0) {
    (*local_1f0)(&local_200,&local_200,__destroy_functor);
  }
  if (local_238 != (code *)0x0) {
    (*local_238)(&local_248,&local_248,__destroy_functor);
  }
  return SVar3;
}

Assistant:

PersistentStorage::Status PersistentStorageJson::LookupAny(BorderRouter const &aValue, std::vector<BorderRouter> &aRet)
{
    std::function<bool(BorderRouter const &)> pred = [](BorderRouter const &) { return true; };

    pred = [aValue](BorderRouter const &el) {
        bool aRet =
            (aValue.mId.mId == EMPTY_ID || (el.mId.mId == aValue.mId.mId)) ||
            (aValue.mNetworkId.mId == EMPTY_ID || (el.mNetworkId.mId == aValue.mNetworkId.mId)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kAddrBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kAddrBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mAddr, aValue.mAgent.mAddr))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPortBit) != 0 || el.mAgent.mPort == aValue.mAgent.mPort)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kThreadVersionBit) != 0 ||
              aValue.mAgent.mThreadVersion == el.mAgent.mThreadVersion)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kStateBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kStateBit) != 0 || el.mAgent.mState == aValue.mAgent.mState)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorNameBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mVendorName, aValue.mAgent.mVendorName))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kModelNameBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kModelNameBit) != 0 ||
              CaseInsensitiveEqual(el.mAgent.mModelName, aValue.mAgent.mModelName))) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kActiveTimestampBit) != 0 ||
              el.mAgent.mActiveTimestamp.Encode() == aValue.mAgent.mActiveTimestamp.Encode())) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kPartitionIdBit) != 0 ||
              el.mAgent.mPartitionId == aValue.mAgent.mPartitionId)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorDataBit) != 0 ||
              el.mAgent.mVendorData == aValue.mAgent.mVendorData)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kVendorOuiBit) != 0 ||
              el.mAgent.mVendorOui == aValue.mAgent.mVendorOui)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrSeqNumberBit) != 0 ||
              el.mAgent.mBbrSeqNumber == aValue.mAgent.mBbrSeqNumber)) ||
            ((aValue.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) == 0 ||
             ((el.mAgent.mPresentFlags & BorderAgent::kBbrPortBit) != 0 ||
              el.mAgent.mBbrPort == aValue.mAgent.mBbrPort));
        return aRet;
    };

    return LookupPred<BorderRouter>(pred, aRet, JSON_BR);
}